

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int filter(int *lb,int *ub,int col,char c)

{
  opcode_t *poVar1;
  int iVar2;
  
  poVar1 = opcodes + *lb;
  iVar2 = *lb + -1;
  while( true ) {
    if ((poVar1->str[col] == c) || (poVar1->str[col] == ' ' && c == '\0')) break;
    *lb = iVar2 + 2;
    poVar1 = poVar1 + 1;
    iVar2 = iVar2 + 1;
    if (*ub <= iVar2) {
      return 0;
    }
  }
  iVar2 = *ub;
  poVar1 = opcodes + iVar2;
  while( true ) {
    iVar2 = iVar2 + -1;
    if (poVar1->str[col] == c) {
      return 1;
    }
    if (poVar1->str[col] == ' ' && c == '\0') break;
    *ub = iVar2;
    poVar1 = poVar1 + -1;
  }
  return 1;
}

Assistant:

int filter(int *lb, int *ub, int col, char c)
{
    while (opcodes[*lb].str[col] != c)
    {
        if (!c && opcodes[*lb].str[col] == ' ')
            break;

        ++*lb;
        if (*lb > *ub)
            return 0;
    }

    while (opcodes[*ub].str[col] != c)
    {
        if (!c && opcodes[*ub].str[col] == ' ')
            break;

        --*ub;
    }

    return 1;
}